

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O2

int * Kit_TruthStatsArray(uint *pArray,int nVars,int nFuncs)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *vMemory;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  piVar2 = (int *)calloc((long)nFuncs,4);
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar3 = (int *)malloc(0x40000);
  uVar6 = 0;
  uVar4 = (ulong)(nVars - 5);
  if (nVars < 6) {
    uVar4 = uVar6;
  }
  vMemory->pArray = piVar3;
  uVar5 = (ulong)(uint)nFuncs;
  if (nFuncs < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = Kit_TruthStats(pArray + ((int)uVar6 << ((byte)uVar4 & 0x1f)),nVars,vMemory);
    piVar2[uVar6] = iVar1;
  }
  free(vMemory->pArray);
  free(vMemory);
  return piVar2;
}

Assistant:

int * Kit_TruthStatsArray( unsigned * pArray, int nVars, int nFuncs )
{
    int f, * pRes = ABC_CALLOC( int, nFuncs );
    int nInts = Abc_TruthWordNum( nVars );
    Vec_Int_t * vMemory = Vec_IntAlloc( 1 << 16 );
    for ( f = 0; f < nFuncs; f++ )
        pRes[f] = Kit_TruthStats( pArray + f*nInts, nVars, vMemory );
    Vec_IntFree( vMemory );
    return pRes;
}